

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::IEEEFloat::roundSignificandWithExponent
          (IEEEFloat *this,integerPart *decSigParts,uint sigPartCount,int exp,
          roundingMode rounding_mode)

{
  Significand *pSVar1;
  short sVar2;
  IEEEFloat *pIVar3;
  opStatus oVar4;
  opStatus oVar5;
  lostFraction lVar6;
  int iVar7;
  byte bVar8;
  byte bVar9;
  IEEEFloat *lhs;
  IEEEFloat *src;
  uint uVar10;
  WordType *lhs_00;
  Significand SVar11;
  uint uVar12;
  IEEEFloat *pIVar13;
  uint lhsParts;
  uint uVar14;
  uint uVar15;
  WordType WVar16;
  Significand *dst;
  ulong uVar17;
  uint *puVar18;
  uint uVar19;
  ulong uVar20;
  WordType WVar21;
  bool bVar22;
  fltSemantics calcSemantics;
  uint partsCount [16];
  integerPart pow5s [1205];
  integerPart pow5Parts [600];
  IEEEFloat pow5;
  IEEEFloat *local_4bf8;
  fltSemantics local_4bd8;
  IEEEFloat *local_4bc8;
  opStatus local_4bbc;
  uint local_4bb8;
  int local_4bb4;
  integerPart *local_4bb0;
  uint local_4ba8 [16];
  IEEEFloat local_4b68 [402];
  IEEEFloat local_25b8 [200];
  IEEEFloat local_12f8 [200];
  
  local_4bd8.maxExponent = 0x7fff;
  local_4bd8.minExponent = -0x7fff;
  local_4bd8.precision = 0;
  local_4bd8.sizeInBits = 0;
  uVar10 = this->semantics->precision;
  uVar12 = -exp;
  if (0 < exp) {
    uVar12 = exp;
  }
  local_4b68[0].semantics = (fltSemantics *)0x5f5e1;
  local_4ba8[2] = 0;
  local_4ba8[3] = 0;
  local_4ba8[0xc] = 0;
  local_4ba8[0xd] = 0;
  local_4ba8[0xe] = 0;
  local_4ba8[0xf] = 0;
  local_4ba8[8] = 0;
  local_4ba8[9] = 0;
  local_4ba8[10] = 0;
  local_4ba8[0xb] = 0;
  local_4ba8[4] = 0;
  local_4ba8[5] = 0;
  local_4ba8[6] = 0;
  local_4ba8[7] = 0;
  local_4ba8[0] = 1;
  local_4ba8[1] = 0;
  local_4bb8 = sigPartCount;
  local_4bb4 = exp;
  local_4bb0 = decSigParts;
  if (0x3fff < uVar12) {
    __assert_fail("power <= maxExponent",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x21e,"unsigned int llvm::powerOf5(APFloatBase::integerPart *, unsigned int)");
  }
  local_25b8[0].semantics =
       *(fltSemantics **)
        (powerOf5(unsigned_long*,unsigned_int)::firstEightPowers + (ulong)(uVar12 & 7) * 8);
  lhsParts = 1;
  local_4bc8 = this;
  if (7 < uVar12) {
    local_4bf8 = local_12f8;
    pIVar13 = local_4b68;
    lhsParts = 1;
    uVar20 = 0xffffffff;
    puVar18 = local_4ba8;
    lhs = local_25b8;
    uVar12 = uVar12 >> 3;
    do {
      uVar17 = (ulong)*puVar18;
      if (*puVar18 == 0) {
        uVar14 = local_4ba8[uVar20 & 0xffffffff];
        lhs_00 = (WordType *)((long)pIVar13 + (ulong)uVar14 * -8);
        APInt::tcFullMultiply((WordType *)pIVar13,lhs_00,lhs_00,uVar14,uVar14);
        uVar17 = (ulong)(uVar14 * 2 - 1);
        if ((&pIVar13->semantics)[uVar17] != (fltSemantics *)0x0) {
          uVar17 = (ulong)(uVar14 * 2);
        }
        *puVar18 = (uint)uVar17;
      }
      uVar19 = (uint)uVar17;
      src = lhs;
      pIVar3 = local_4bf8;
      uVar14 = lhsParts;
      if ((uVar12 & 1) != 0) {
        APInt::tcFullMultiply
                  ((WordType *)local_4bf8,(WordType *)lhs,(WordType *)pIVar13,lhsParts,uVar19);
        uVar14 = (uVar19 - 1) + lhsParts;
        src = local_4bf8;
        pIVar3 = lhs;
        if ((&local_4bf8->semantics)[uVar14] != (fltSemantics *)0x0) {
          uVar14 = lhsParts + uVar19;
        }
      }
      lhsParts = uVar14;
      local_4bf8 = pIVar3;
      pIVar13 = (IEEEFloat *)(&pIVar13->semantics + uVar17);
      uVar20 = uVar20 + 1;
      puVar18 = puVar18 + 1;
      bVar22 = 1 < uVar12;
      lhs = src;
      uVar12 = uVar12 >> 1;
    } while (bVar22);
    if (src != local_25b8) {
      APInt::tcAssign((WordType *)local_25b8,(WordType *)src,lhsParts);
    }
  }
  uVar10 = uVar10 + 0x4a >> 6;
  pSVar1 = &local_4bc8->significand;
  pIVar13 = local_4bc8;
  do {
    local_4bd8.precision = uVar10 * 0x40 - 1;
    uVar12 = local_4bd8.precision - pIVar13->semantics->precision;
    IEEEFloat(local_4b68,&local_4bd8,uninitialized);
    makeZero(local_4b68,(bool)((pIVar13->field_0x12 & 8) >> 3));
    IEEEFloat(local_12f8,&local_4bd8);
    oVar4 = convertFromUnsignedParts(local_4b68,local_4bb0,local_4bb8,rmNearestTiesToEven);
    oVar5 = convertFromUnsignedParts
                      (local_12f8,(integerPart *)local_25b8,lhsParts,rmNearestTiesToEven);
    local_4b68[0].exponent = local_4b68[0].exponent + (short)local_4bb4;
    uVar14 = uVar12;
    if (local_4bb4 < 0) {
      lVar6 = divideSignificand(local_4b68,local_12f8);
      sVar2 = pIVar13->semantics->minExponent;
      if ((local_4b68[0].exponent < sVar2) &&
         (uVar14 = ((int)sVar2 - (int)local_4b68[0].exponent) + uVar12,
         uVar12 = local_4bd8.precision, uVar14 < local_4bd8.precision)) {
        uVar12 = uVar14;
      }
      uVar19 = (uint)(oVar5 != opOK || lVar6 != lfExactlyZero) * 2;
    }
    else {
      lVar6 = multiplySignificand(local_4b68,local_12f8,(IEEEFloat *)0x0);
      uVar19 = (uint)(oVar5 != opOK);
    }
    SVar11 = (Significand)&local_4b68[0].significand;
    if ((local_4b68[0].semantics)->precision - 0x40 < 0xffffff80) {
      SVar11 = local_4b68[0].significand;
    }
    iVar7 = APInt::tcExtractBit(SVar11.parts,local_4bd8.precision - 1);
    pIVar13 = local_4bc8;
    if (iVar7 != 1) {
      __assert_fail("APInt::tcExtractBit (decSig.significandParts(), calcSemantics.precision - 1) == 1"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x969,
                    "IEEEFloat::opStatus llvm::detail::IEEEFloat::roundSignificandWithExponent(const integerPart *, unsigned int, int, roundingMode)"
                   );
    }
    iVar7 = (uVar19 + 1) - (uint)(oVar4 == opOK);
    uVar19 = (uint)(lVar6 != lfExactlyZero) + iVar7 * 2;
    if (iVar7 == 0) {
      uVar19 = (uint)(lVar6 != lfExactlyZero) * 2;
    }
    SVar11 = (Significand)&local_4b68[0].significand;
    if ((local_4b68[0].semantics)->precision - 0x40 < 0xffffff80) {
      SVar11 = local_4b68[0].significand;
    }
    if (uVar12 == 0) {
      __assert_fail("bits != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x1ee,
                    "APFloatBase::integerPart llvm::ulpsFromBoundary(const APFloatBase::integerPart *, unsigned int, bool)"
                   );
    }
    uVar15 = uVar12 - 1 >> 6;
    bVar8 = (byte)(uVar12 - 1);
    bVar9 = bVar8 & 0x3f ^ 0x3f;
    uVar20 = (((Significand *)(SVar11.parts + uVar15))->part << bVar9) >> bVar9;
    uVar17 = 1L << (bVar8 & 0x3f);
    if ((rounding_mode & ~rmNearestTiesToAway) != rmNearestTiesToEven) {
      uVar17 = 0;
    }
    if (uVar12 < 0x41) {
      WVar16 = uVar20 - uVar17;
      WVar21 = -WVar16;
      if (0 < (long)WVar16) {
        WVar21 = WVar16;
      }
    }
    else if (uVar20 == uVar17) {
      do {
        uVar15 = uVar15 - 1;
        if (uVar15 == 0) {
          WVar21 = *SVar11.parts;
          goto LAB_00165f8b;
        }
      } while (((Significand *)(SVar11.parts + uVar15))->part == 0);
      WVar21 = 0xffffffffffffffff;
    }
    else {
      WVar21 = 0xffffffffffffffff;
      if (uVar20 == uVar17 - 1) {
        do {
          uVar15 = uVar15 - 1;
          if (uVar15 == 0) {
            WVar21 = -*SVar11.parts;
            break;
          }
        } while (((Significand *)(SVar11.parts + uVar15))->part == 0xffffffffffffffff);
      }
    }
LAB_00165f8b:
    if ((ulong)uVar19 <= WVar21 * 2) {
      uVar15 = local_4bc8->semantics->precision;
      dst = pSVar1;
      if (uVar15 - 0x40 < 0xffffff80) {
        dst = (Significand *)(local_4bc8->significand).parts;
      }
      APInt::tcExtract(&dst->part,uVar15 + 0x40 >> 6,SVar11.parts,local_4bd8.precision - uVar12,
                       uVar12);
      pIVar13->exponent =
           ((short)uVar12 + (short)local_4b68[0]._16_4_ + (short)pIVar13->semantics->precision) -
           (short)local_4bd8.precision;
      SVar11 = (Significand)&local_4b68[0].significand;
      if ((local_4b68[0].semantics)->precision - 0x40 < 0xffffff80) {
        SVar11 = local_4b68[0].significand;
      }
      lVar6 = lostFractionThroughTruncation
                        (SVar11.parts,(local_4b68[0].semantics)->precision + 0x40 >> 6,uVar14);
      local_4bbc = normalize(pIVar13,rounding_mode,lVar6);
    }
    ~IEEEFloat(local_12f8);
    ~IEEEFloat(local_4b68);
    uVar10 = uVar10 * 2;
    if ((ulong)uVar19 <= WVar21 * 2) {
      return local_4bbc;
    }
  } while( true );
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::roundSignificandWithExponent(const integerPart *decSigParts,
                                        unsigned sigPartCount, int exp,
                                        roundingMode rounding_mode) {
  unsigned int parts, pow5PartCount;
  fltSemantics calcSemantics = { 32767, -32767, 0, 0 };
  integerPart pow5Parts[maxPowerOfFiveParts];
  bool isNearest;

  isNearest = (rounding_mode == rmNearestTiesToEven ||
               rounding_mode == rmNearestTiesToAway);

  parts = partCountForBits(semantics->precision + 11);

  /* Calculate pow(5, abs(exp)).  */
  pow5PartCount = powerOf5(pow5Parts, exp >= 0 ? exp: -exp);

  for (;; parts *= 2) {
    opStatus sigStatus, powStatus;
    unsigned int excessPrecision, truncatedBits;

    calcSemantics.precision = parts * integerPartWidth - 1;
    excessPrecision = calcSemantics.precision - semantics->precision;
    truncatedBits = excessPrecision;

    IEEEFloat decSig(calcSemantics, uninitialized);
    decSig.makeZero(sign);
    IEEEFloat pow5(calcSemantics);

    sigStatus = decSig.convertFromUnsignedParts(decSigParts, sigPartCount,
                                                rmNearestTiesToEven);
    powStatus = pow5.convertFromUnsignedParts(pow5Parts, pow5PartCount,
                                              rmNearestTiesToEven);
    /* Add exp, as 10^n = 5^n * 2^n.  */
    decSig.exponent += exp;

    lostFraction calcLostFraction;
    integerPart HUerr, HUdistance;
    unsigned int powHUerr;

    if (exp >= 0) {
      /* multiplySignificand leaves the precision-th bit set to 1.  */
      calcLostFraction = decSig.multiplySignificand(pow5, nullptr);
      powHUerr = powStatus != opOK;
    } else {
      calcLostFraction = decSig.divideSignificand(pow5);
      /* Denormal numbers have less precision.  */
      if (decSig.exponent < semantics->minExponent) {
        excessPrecision += (semantics->minExponent - decSig.exponent);
        truncatedBits = excessPrecision;
        if (excessPrecision > calcSemantics.precision)
          excessPrecision = calcSemantics.precision;
      }
      /* Extra half-ulp lost in reciprocal of exponent.  */
      powHUerr = (powStatus == opOK && calcLostFraction == lfExactlyZero) ? 0:2;
    }

    /* Both multiplySignificand and divideSignificand return the
       result with the integer bit set.  */
    assert(APInt::tcExtractBit
           (decSig.significandParts(), calcSemantics.precision - 1) == 1);

    HUerr = HUerrBound(calcLostFraction != lfExactlyZero, sigStatus != opOK,
                       powHUerr);
    HUdistance = 2 * ulpsFromBoundary(decSig.significandParts(),
                                      excessPrecision, isNearest);

    /* Are we guaranteed to round correctly if we truncate?  */
    if (HUdistance >= HUerr) {
      APInt::tcExtract(significandParts(), partCount(), decSig.significandParts(),
                       calcSemantics.precision - excessPrecision,
                       excessPrecision);
      /* Take the exponent of decSig.  If we tcExtract-ed less bits
         above we must adjust our exponent to compensate for the
         implicit right shift.  */
      exponent = (decSig.exponent + semantics->precision
                  - (calcSemantics.precision - excessPrecision));
      calcLostFraction = lostFractionThroughTruncation(decSig.significandParts(),
                                                       decSig.partCount(),
                                                       truncatedBits);
      return normalize(rounding_mode, calcLostFraction);
    }
  }
}